

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  fpclass_type fVar1;
  int32_t iVar2;
  type_conflict5 tVar3;
  long lVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  int iVar6;
  uint uVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  byte bVar11;
  double local_728;
  long local_720;
  uint local_714;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_710;
  cpp_dec_float<200U,_int,_void> *local_708;
  cpp_dec_float<200U,_int,_void> *local_700;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_678;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_578;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_4f8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_4e8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  cpp_dec_float<200U,_int,_void> local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar11 = 0;
  iVar6 = (this->matrix).thesize;
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 0x1c;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems[6] = 0;
  local_438.data._M_elems[7] = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.data._M_elems[10] = 0;
  local_438.data._M_elems[0xb] = 0;
  local_438.data._M_elems[0xc] = 0;
  local_438.data._M_elems[0xd] = 0;
  local_438.data._M_elems[0xe] = 0;
  local_438.data._M_elems[0xf] = 0;
  local_438.data._M_elems[0x18] = 0;
  local_438.data._M_elems[0x19] = 0;
  local_438.data._M_elems._104_5_ = 0;
  local_438.data._M_elems[0x1b]._1_3_ = 0;
  local_438.exp = 0;
  local_438.neg = false;
  local_438.data._M_elems[0x10] = 0;
  local_438.data._M_elems[0x11] = 0;
  local_438.data._M_elems[0x12] = 0;
  local_438.data._M_elems[0x13] = 0;
  local_438.data._M_elems[0x14] = 0;
  local_438.data._M_elems[0x15] = 0;
  local_438.data._M_elems[0x16] = 0;
  local_438.data._M_elems[0x17] = 0;
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x1c;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems[0xe] = 0;
  local_2b8.data._M_elems[0xf] = 0;
  local_2b8.data._M_elems[0x10] = 0;
  local_2b8.data._M_elems[0x11] = 0;
  local_2b8.data._M_elems[0x12] = 0;
  local_2b8.data._M_elems[0x13] = 0;
  local_2b8.data._M_elems[0x18] = 0;
  local_2b8.data._M_elems[0x19] = 0;
  local_2b8.data._M_elems._104_5_ = 0;
  local_2b8.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  local_2b8.data._M_elems[0x14] = 0;
  local_2b8.data._M_elems[0x15] = 0;
  local_2b8.data._M_elems[0x16] = 0;
  local_2b8.data._M_elems[0x17] = 0;
  local_678.fpclass = cpp_dec_float_finite;
  local_678.prec_elem = 0x1c;
  local_678.data._M_elems[0] = 0;
  local_678.data._M_elems[1] = 0;
  local_678.data._M_elems[2] = 0;
  local_678.data._M_elems[3] = 0;
  local_678.data._M_elems[4] = 0;
  local_678.data._M_elems[5] = 0;
  local_678.data._M_elems[6] = 0;
  local_678.data._M_elems[7] = 0;
  local_678.data._M_elems[8] = 0;
  local_678.data._M_elems[9] = 0;
  local_678.data._M_elems[10] = 0;
  local_678.data._M_elems[0xb] = 0;
  local_678.data._M_elems[0xc] = 0;
  local_678.data._M_elems[0xd] = 0;
  local_678.data._M_elems[0xe] = 0;
  local_678.data._M_elems[0xf] = 0;
  local_678.data._M_elems[0x10] = 0;
  local_678.data._M_elems[0x11] = 0;
  local_678.data._M_elems[0x12] = 0;
  local_678.data._M_elems[0x13] = 0;
  local_678.data._M_elems[0x14] = 0;
  local_678.data._M_elems[0x15] = 0;
  local_678.data._M_elems[0x16] = 0;
  local_678.data._M_elems[0x17] = 0;
  local_678.data._M_elems[0x18] = 0;
  local_678.data._M_elems[0x19] = 0;
  local_678.data._M_elems._104_5_ = 0;
  local_678.data._M_elems[0x1b]._1_3_ = 0;
  local_678.exp = 0;
  local_678.neg = false;
  local_578.exp = 0;
  local_578.neg = false;
  local_578.fpclass = cpp_dec_float_finite;
  local_578.prec_elem = 0x1c;
  local_578.data._M_elems[0] = 0;
  local_578.data._M_elems[1] = 0;
  local_578.data._M_elems[2] = 0;
  local_578.data._M_elems[3] = 0;
  local_578.data._M_elems[4] = 0;
  local_578.data._M_elems[5] = 0;
  local_578.data._M_elems[6] = 0;
  local_578.data._M_elems[7] = 0;
  local_578.data._M_elems[8] = 0;
  local_578.data._M_elems[9] = 0;
  local_578.data._M_elems[10] = 0;
  local_578.data._M_elems[0xb] = 0;
  local_578.data._M_elems[0xc] = 0;
  local_578.data._M_elems[0xd] = 0;
  local_578.data._M_elems[0xe] = 0;
  local_578.data._M_elems[0xf] = 0;
  local_578.data._M_elems[0x10] = 0;
  local_578.data._M_elems[0x11] = 0;
  local_578.data._M_elems[0x12] = 0;
  local_578.data._M_elems[0x13] = 0;
  local_578.data._M_elems[0x14] = 0;
  local_578.data._M_elems[0x15] = 0;
  local_578.data._M_elems[0x16] = 0;
  local_578.data._M_elems[0x17] = 0;
  local_578.data._M_elems[0x18] = 0;
  local_578.data._M_elems[0x19] = 0;
  local_578.data._M_elems._104_5_ = 0;
  local_578.data._M_elems[0x1b]._1_3_ = 0;
  local_708 = &__return_storage_ptr__->m_backend;
  local_700 = &tolerance->m_backend;
  if ((long)iVar6 < 1) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  }
  else {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_4e8,
               &(this->theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&x,iVar6,(shared_ptr<soplex::Tolerances> *)&local_4e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e8._M_refcount);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_4f8,
               &(this->theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    local_720 = (long)iVar6;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&y,iVar6,(shared_ptr<soplex::Tolerances> *)&local_4f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f8._M_refcount);
    if (this->thestatus < REGULAR) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (local_708,0,(type *)0x0);
    }
    else {
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      local_728 = 1.0;
      local_710 = this;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result_1.m_backend,local_720,(type *)0x0);
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 0x1c;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems[6] = 0;
      result_2.m_backend.data._M_elems[7] = 0;
      result_2.m_backend.data._M_elems[8] = 0;
      result_2.m_backend.data._M_elems[9] = 0;
      result_2.m_backend.data._M_elems[10] = 0;
      result_2.m_backend.data._M_elems[0xb] = 0;
      result_2.m_backend.data._M_elems[0xc] = 0;
      result_2.m_backend.data._M_elems[0xd] = 0;
      result_2.m_backend.data._M_elems[0xe] = 0;
      result_2.m_backend.data._M_elems[0xf] = 0;
      result_2.m_backend.data._M_elems[0x10] = 0;
      result_2.m_backend.data._M_elems[0x11] = 0;
      result_2.m_backend.data._M_elems[0x12] = 0;
      result_2.m_backend.data._M_elems[0x13] = 0;
      result_2.m_backend.data._M_elems[0x14] = 0;
      result_2.m_backend.data._M_elems[0x15] = 0;
      result_2.m_backend.data._M_elems[0x16] = 0;
      result_2.m_backend.data._M_elems[0x17] = 0;
      result_2.m_backend.data._M_elems[0x18] = 0;
      result_2.m_backend.data._M_elems[0x19] = 0;
      result_2.m_backend.data._M_elems._104_5_ = 0;
      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&result_2.m_backend,&local_728,&result_1.m_backend);
      pnVar8 = &result_2;
      pcVar9 = &local_678;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar11 * -2 + 1) * 4);
      }
      local_678.exp = result_2.m_backend.exp;
      local_678.neg = result_2.m_backend.neg;
      local_678.fpclass = result_2.m_backend.fpclass;
      local_678.prec_elem = result_2.m_backend.prec_elem;
      for (iVar6 = 0; lVar4 = 0x1c, pcVar9 = &local_678, pnVar8 = &local_b0,
          (uint)local_720 != iVar6; iVar6 = iVar6 + 1) {
        for (; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pnVar8->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar11 * -2 + 1) * 4);
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = local_678.exp;
        local_b0.m_backend.neg = local_678.neg;
        local_b0.m_backend.fpclass = local_678.fpclass;
        local_b0.m_backend.prec_elem = local_678.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&x,iVar6,&local_b0);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&y,&x);
      uVar7 = 0;
      if (maxiters < 1) {
        maxiters = 0;
      }
      lVar4 = 0x1c;
      local_714 = maxiters;
      for (; local_714 != uVar7; uVar7 = uVar7 + 1) {
        pcVar9 = &local_678;
        pcVar10 = &local_578;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
        }
        local_578.exp = local_678.exp;
        local_578.neg = local_678.neg;
        local_578.fpclass = local_678.fpclass;
        local_578.prec_elem = local_678.prec_elem;
        multBaseWith(local_710,&x,&y);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&result_2.m_backend,&y);
        pcVar9 = &result_2.m_backend;
        pcVar10 = &local_678;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
        }
        local_678.exp = result_2.m_backend.exp;
        local_678.neg = result_2.m_backend.neg;
        local_678.fpclass = result_2.m_backend.fpclass;
        local_678.prec_elem = result_2.m_backend.prec_elem;
        if (2 < uVar7) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,&local_678,&local_578);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_2.m_backend,(multiprecision *)&result.m_backend,arg);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,local_700,&local_678);
          tVar3 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_2.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_1.m_backend);
          if (tVar3) break;
        }
        multWithBase(local_710,&y,&x);
        local_728 = 1.0;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&result_1.m_backend,&x);
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&result_2.m_backend,&local_728,&result_1.m_backend);
        pcVar9 = &result_2.m_backend;
        pcVar10 = &local_578;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
        }
        local_578.exp = result_2.m_backend.exp;
        local_578.neg = result_2.m_backend.neg;
        fVar1 = result_2.m_backend.fpclass;
        iVar2 = result_2.m_backend.prec_elem;
        local_578.fpclass = result_2.m_backend.fpclass;
        local_578.prec_elem = result_2.m_backend.prec_elem;
        pcVar9 = &local_578;
        pnVar8 = &local_1b0;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar8->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = result_2.m_backend.exp;
        local_1b0.m_backend.neg = result_2.m_backend.neg;
        local_1b0.m_backend.fpclass = fVar1;
        local_1b0.m_backend.prec_elem = iVar2;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)&x,&local_1b0);
      }
      pcVar9 = &local_678;
      pcVar10 = &local_438;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
      }
      local_438.exp = local_678.exp;
      local_438.neg = local_678.neg;
      local_438.fpclass = local_678.fpclass;
      local_438.prec_elem = local_678.prec_elem;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&x);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&y);
      lVar4 = local_720;
      local_728 = 1.0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result_1.m_backend,local_720,(type *)0x0);
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 0x1c;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems[6] = 0;
      result_2.m_backend.data._M_elems[7] = 0;
      result_2.m_backend.data._M_elems[8] = 0;
      result_2.m_backend.data._M_elems[9] = 0;
      result_2.m_backend.data._M_elems[10] = 0;
      result_2.m_backend.data._M_elems[0xb] = 0;
      result_2.m_backend.data._M_elems[0xc] = 0;
      result_2.m_backend.data._M_elems[0xd] = 0;
      result_2.m_backend.data._M_elems[0xe] = 0;
      result_2.m_backend.data._M_elems[0xf] = 0;
      result_2.m_backend.data._M_elems[0x10] = 0;
      result_2.m_backend.data._M_elems[0x11] = 0;
      result_2.m_backend.data._M_elems[0x12] = 0;
      result_2.m_backend.data._M_elems[0x13] = 0;
      result_2.m_backend.data._M_elems[0x14] = 0;
      result_2.m_backend.data._M_elems[0x15] = 0;
      result_2.m_backend.data._M_elems[0x16] = 0;
      result_2.m_backend.data._M_elems[0x17] = 0;
      result_2.m_backend.data._M_elems[0x18] = 0;
      result_2.m_backend.data._M_elems[0x19] = 0;
      result_2.m_backend.data._M_elems._104_5_ = 0;
      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&result_2.m_backend,&local_728,&result_1.m_backend);
      pnVar8 = &result_2;
      pcVar9 = &local_678;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar11 * -2 + 1) * 4);
      }
      local_678.exp = result_2.m_backend.exp;
      local_678.neg = result_2.m_backend.neg;
      local_678.fpclass = result_2.m_backend.fpclass;
      local_678.prec_elem = result_2.m_backend.prec_elem;
      for (iVar6 = 0; lVar5 = 0x1c, pcVar9 = &local_678, pnVar8 = &local_130, (int)lVar4 != iVar6;
          iVar6 = iVar6 + 1) {
        for (; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar8->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar11 * -2 + 1) * 4);
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = local_678.exp;
        local_130.m_backend.neg = local_678.neg;
        local_130.m_backend.fpclass = local_678.fpclass;
        local_130.m_backend.prec_elem = local_678.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&x,iVar6,&local_130);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&y,&x);
      lVar4 = 0x1c;
      for (uVar7 = 0; local_714 != uVar7; uVar7 = uVar7 + 1) {
        pcVar9 = &local_678;
        pcVar10 = &local_578;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
        }
        local_578.exp = local_678.exp;
        local_578.neg = local_678.neg;
        local_578.fpclass = local_678.fpclass;
        local_578.prec_elem = local_678.prec_elem;
        (*local_710->factor->_vptr_SLinSolver[0xd])(local_710->factor,&x,&y);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(&x);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&result_2.m_backend,&x);
        pcVar9 = &result_2.m_backend;
        pcVar10 = &local_678;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
        }
        local_678.exp = result_2.m_backend.exp;
        local_678.neg = result_2.m_backend.neg;
        local_678.fpclass = result_2.m_backend.fpclass;
        local_678.prec_elem = result_2.m_backend.prec_elem;
        if (2 < uVar7) {
          local_720 = CONCAT44(local_720._4_4_,uVar7);
          result_3.m_backend.fpclass = cpp_dec_float_finite;
          result_3.m_backend.prec_elem = 0x1c;
          result_3.m_backend.data._M_elems[0] = 0;
          result_3.m_backend.data._M_elems[1] = 0;
          result_3.m_backend.data._M_elems[2] = 0;
          result_3.m_backend.data._M_elems[3] = 0;
          result_3.m_backend.data._M_elems[4] = 0;
          result_3.m_backend.data._M_elems[5] = 0;
          result_3.m_backend.data._M_elems[6] = 0;
          result_3.m_backend.data._M_elems[7] = 0;
          result_3.m_backend.data._M_elems[8] = 0;
          result_3.m_backend.data._M_elems[9] = 0;
          result_3.m_backend.data._M_elems[10] = 0;
          result_3.m_backend.data._M_elems[0xb] = 0;
          result_3.m_backend.data._M_elems[0xc] = 0;
          result_3.m_backend.data._M_elems[0xd] = 0;
          result_3.m_backend.data._M_elems[0xe] = 0;
          result_3.m_backend.data._M_elems[0xf] = 0;
          result_3.m_backend.data._M_elems[0x10] = 0;
          result_3.m_backend.data._M_elems[0x11] = 0;
          result_3.m_backend.data._M_elems[0x12] = 0;
          result_3.m_backend.data._M_elems[0x13] = 0;
          result_3.m_backend.data._M_elems[0x14] = 0;
          result_3.m_backend.data._M_elems[0x15] = 0;
          result_3.m_backend.data._M_elems[0x16] = 0;
          result_3.m_backend.data._M_elems[0x17] = 0;
          result_3.m_backend.data._M_elems[0x18] = 0;
          result_3.m_backend.data._M_elems[0x19] = 0;
          result_3.m_backend.data._M_elems._104_5_ = 0;
          result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_3.m_backend.exp = 0;
          result_3.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_3.m_backend,&local_678,&local_578);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_2.m_backend,(multiprecision *)&result_3.m_backend,arg_00);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,local_700,&local_678);
          tVar3 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_2.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_1.m_backend);
          uVar7 = (uint)local_720;
          if (tVar3) break;
        }
        (*local_710->factor->_vptr_SLinSolver[0x15])(local_710->factor,&y,&x);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(&y);
        local_728 = 1.0;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&result_1.m_backend,&y);
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&result_2.m_backend,&local_728,&result_1.m_backend);
        pcVar9 = &result_2.m_backend;
        pcVar10 = &local_578;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
        }
        local_578.exp = result_2.m_backend.exp;
        local_578.neg = result_2.m_backend.neg;
        fVar1 = result_2.m_backend.fpclass;
        iVar2 = result_2.m_backend.prec_elem;
        local_578.fpclass = result_2.m_backend.fpclass;
        local_578.prec_elem = result_2.m_backend.prec_elem;
        pcVar9 = &local_578;
        pnVar8 = &local_230;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar8->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        local_230.m_backend.exp = result_2.m_backend.exp;
        local_230.m_backend.neg = result_2.m_backend.neg;
        local_230.m_backend.fpclass = fVar1;
        local_230.m_backend.prec_elem = iVar2;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)&y,&local_230);
      }
      pcVar9 = &local_678;
      pcVar10 = &local_2b8;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar10->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
      }
      local_2b8.exp = local_678.exp;
      local_2b8.neg = local_678.neg;
      local_2b8.fpclass = local_678.fpclass;
      local_2b8.prec_elem = local_678.prec_elem;
      local_708->fpclass = cpp_dec_float_finite;
      local_708->prec_elem = 0x1c;
      (local_708->data)._M_elems[0] = 0;
      (local_708->data)._M_elems[1] = 0;
      (local_708->data)._M_elems[2] = 0;
      (local_708->data)._M_elems[3] = 0;
      (local_708->data)._M_elems[4] = 0;
      (local_708->data)._M_elems[5] = 0;
      (local_708->data)._M_elems[6] = 0;
      (local_708->data)._M_elems[7] = 0;
      (local_708->data)._M_elems[8] = 0;
      (local_708->data)._M_elems[9] = 0;
      (local_708->data)._M_elems[10] = 0;
      (local_708->data)._M_elems[0xb] = 0;
      (local_708->data)._M_elems[0xc] = 0;
      (local_708->data)._M_elems[0xd] = 0;
      (local_708->data)._M_elems[0xe] = 0;
      (local_708->data)._M_elems[0xf] = 0;
      (local_708->data)._M_elems[0x10] = 0;
      (local_708->data)._M_elems[0x11] = 0;
      (local_708->data)._M_elems[0x12] = 0;
      (local_708->data)._M_elems[0x13] = 0;
      (local_708->data)._M_elems[0x14] = 0;
      (local_708->data)._M_elems[0x15] = 0;
      (local_708->data)._M_elems[0x16] = 0;
      (local_708->data)._M_elems[0x17] = 0;
      (local_708->data)._M_elems[0x18] = 0;
      (local_708->data)._M_elems[0x19] = 0;
      (local_708->data)._M_elems[0x1a] = 0;
      (local_708->data)._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(local_708->data)._M_elems + 0x6d) = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (local_708,&local_438,&local_2b8);
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&y);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&x);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_708;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}